

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
            field_0x20 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x8a2258;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0x8a2370;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8a2280;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8a22a8;
  *(undefined8 *)((long)pvVar1 + -0x98) = 0x8a22d0;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x8a22f8;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x8a2320;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8a2348;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__008a2390);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}